

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_plu_t * matd_plu(matd_t *a)

{
  uint **ppuVar1;
  uint **ppuVar2;
  undefined1 *__src;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 *__dest;
  undefined1 *local_88;
  uint local_80;
  uint local_7c;
  uint *puStack_78;
  int i_3;
  double LUjj;
  ulong uStack_68;
  int k_1;
  unsigned_long __vla_expr0;
  uint local_54;
  uint local_50;
  int i_2;
  int p;
  int k;
  double acc;
  int kmax;
  int i_1;
  int j;
  int i;
  matd_plu_t *mlu;
  matd_t *lu;
  uint *puStack_18;
  int pivsign;
  uint *piv;
  matd_t *a_local;
  
  piv = &a->nrows;
  puStack_18 = (uint *)calloc((ulong)a->nrows,4);
  lu._4_4_ = 1;
  mlu = (matd_plu_t *)matd_copy((matd_t *)piv);
  if (*piv != piv[1]) {
    __assert_fail("a->nrows == a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x5df,"matd_plu_t *matd_plu(const matd_t *)");
  }
  _j = (matd_plu_t *)calloc(1,0x20);
  for (i_1 = 0; (uint)i_1 < *piv; i_1 = i_1 + 1) {
    puStack_18[i_1] = i_1;
  }
  __vla_expr0 = (unsigned_long)&local_88;
  for (kmax = 0; (uint)kmax < piv[1]; kmax = kmax + 1) {
    for (acc._4_4_ = 0; acc._4_4_ < *piv; acc._4_4_ = acc._4_4_ + 1) {
      if ((int)acc._4_4_ < kmax) {
        local_80 = acc._4_4_;
      }
      else {
        local_80 = kmax;
      }
      acc._0_4_ = local_80;
      _p = 0.0;
      for (i_2 = 0; i_2 < (int)local_80; i_2 = i_2 + 1) {
        _p = (double)(&mlu->piv)[acc._4_4_ * *(int *)&mlu->field_0x4 + i_2] *
             (double)(&mlu->piv)[(uint)(i_2 * *(int *)&mlu->field_0x4 + kmax)] + _p;
      }
      uVar5 = acc._4_4_ * *(int *)&mlu->field_0x4 + kmax;
      (&mlu->piv)[uVar5] = (uint *)((double)(&mlu->piv)[uVar5] - _p);
    }
    local_50 = kmax;
    local_54 = kmax;
    while (local_54 = local_54 + 1, local_54 < (uint)mlu->singular) {
      if (ABS((double)(&mlu->piv)[local_50 * *(int *)&mlu->field_0x4 + kmax]) <
          ABS((double)(&mlu->piv)[local_54 * *(int *)&mlu->field_0x4 + kmax])) {
        local_50 = local_54;
      }
    }
    if (local_50 != kmax) {
      uStack_68 = (ulong)*(uint *)&mlu->field_0x4;
      __dest = (undefined1 *)(__vla_expr0 + -(uStack_68 * 8 + 0xf & 0xfffffffffffffff0));
      uVar3 = local_50 * *(int *)&mlu->field_0x4;
      ppuVar1 = &mlu->piv;
      uVar5 = *(uint *)&mlu->field_0x4;
      local_88 = __dest;
      *(undefined8 *)(__dest + -8) = 0x4f1c34;
      memcpy(__dest,ppuVar1 + uVar3,(ulong)uVar5 << 3);
      uVar3 = local_50 * *(int *)&mlu->field_0x4;
      ppuVar1 = &mlu->piv;
      uVar4 = kmax * *(int *)&mlu->field_0x4;
      ppuVar2 = &mlu->piv;
      uVar5 = *(uint *)&mlu->field_0x4;
      *(undefined8 *)(__dest + -8) = 0x4f1c84;
      memcpy(ppuVar1 + uVar3,ppuVar2 + uVar4,(ulong)uVar5 << 3);
      __src = local_88;
      uVar3 = kmax * *(int *)&mlu->field_0x4;
      ppuVar1 = &mlu->piv;
      uVar5 = *(uint *)&mlu->field_0x4;
      *(undefined8 *)(__dest + -8) = 0x4f1cb9;
      memcpy(ppuVar1 + uVar3,__src,(ulong)uVar5 << 3);
      LUjj._4_4_ = puStack_18[(int)local_50];
      puStack_18[(int)local_50] = puStack_18[kmax];
      puStack_18[kmax] = LUjj._4_4_;
      lu._4_4_ = -lu._4_4_;
    }
    puStack_78 = (&mlu->piv)[(uint)(kmax * *(int *)&mlu->field_0x4 + kmax)];
    if (ABS((double)puStack_78) < 1e-08) {
      _j->singular = 1;
    }
    if ((((uint)kmax < *(uint *)&mlu->field_0x4) && ((uint)kmax < (uint)mlu->singular)) &&
       (((double)puStack_78 != 0.0 || (NAN((double)puStack_78))))) {
      puStack_78 = (uint *)(1.0 / (double)puStack_78);
      local_7c = kmax;
      while (local_7c = local_7c + 1, local_7c < (uint)mlu->singular) {
        uVar5 = local_7c * *(int *)&mlu->field_0x4 + kmax;
        (&mlu->piv)[uVar5] = (uint *)((double)puStack_78 * (double)(&mlu->piv)[uVar5]);
      }
    }
  }
  _j->lu = (matd_t *)mlu;
  _j->piv = puStack_18;
  _j->pivsign = lu._4_4_;
  return _j;
}

Assistant:

matd_plu_t *matd_plu(const matd_t *a)
{
    unsigned int *piv = calloc(a->nrows, sizeof(unsigned int));
    int pivsign = 1;
    matd_t *lu = matd_copy(a);

    // only for square matrices.
    assert(a->nrows == a->ncols);

    matd_plu_t *mlu = calloc(1, sizeof(matd_plu_t));

    for (int i = 0; i < a->nrows; i++)
        piv[i] = i;

    for (int j = 0; j < a->ncols; j++) {
        for (int i = 0; i < a->nrows; i++) {
            int kmax = i < j ? i : j; // min(i,j)

            // compute dot product of row i with column j (up through element kmax)
            double acc = 0;
            for (int k = 0; k < kmax; k++)
                acc += MATD_EL(lu, i, k) * MATD_EL(lu, k, j);

            MATD_EL(lu, i, j) -= acc;
        }

        // find pivot and exchange if necessary.
        int p = j;
        if (1) {
            for (int i = j+1; i < lu->nrows; i++) {
                if (fabs(MATD_EL(lu,i,j)) > fabs(MATD_EL(lu, p, j))) {
                    p = i;
                }
            }
        }

        // swap rows p and j?
        if (p != j) {
            TYPE tmp[lu->ncols];
            memcpy(tmp, &MATD_EL(lu, p, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, p, 0), &MATD_EL(lu, j, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, j, 0), tmp, sizeof(TYPE) * lu->ncols);
            int k = piv[p];
            piv[p] = piv[j];
            piv[j] = k;
            pivsign = -pivsign;
        }

        double LUjj = MATD_EL(lu, j, j);

        // If our pivot is very small (which means the matrix is
        // singular or nearly singular), replace with a new pivot of the
        // right sign.
        if (fabs(LUjj) < MATD_EPS) {
/*
            if (LUjj < 0)
                LUjj = -MATD_EPS;
            else
                LUjj = MATD_EPS;

            MATD_EL(lu, j, j) = LUjj;
*/
            mlu->singular = 1;
        }

        if (j < lu->ncols && j < lu->nrows && LUjj != 0) {
            LUjj = 1.0 / LUjj;
            for (int i = j+1; i < lu->nrows; i++)
                MATD_EL(lu, i, j) *= LUjj;
        }
    }

    mlu->lu = lu;
    mlu->piv = piv;
    mlu->pivsign = pivsign;

    return mlu;
}